

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O2

void Cec_ManSimMemRelink(Cec_ManSim_t *p)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  
  piVar1 = &p->MemFree;
  iVar3 = p->nWords;
  for (uVar2 = (iVar3 + 1) * p->nMems; iVar3 + uVar2 + 1 < (uint)p->nWordsAlloc;
      uVar2 = uVar2 + 1 + iVar3) {
    *piVar1 = uVar2;
    piVar1 = (int *)(p->pMems + uVar2);
    iVar3 = p->nWords;
  }
  *piVar1 = 0;
  p->nWordsOld = p->nWords;
  return;
}

Assistant:

void Cec_ManSimMemRelink( Cec_ManSim_t * p )
{
    unsigned * pPlace, Ent;
    pPlace = (unsigned *)&p->MemFree;
    for ( Ent = p->nMems * (p->nWords + 1); 
          Ent + p->nWords + 1 < (unsigned)p->nWordsAlloc; 
          Ent += p->nWords + 1 )
    {
        *pPlace = Ent;
        pPlace = p->pMems + Ent;
    }
    *pPlace = 0;
    p->nWordsOld = p->nWords;
}